

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void wasm::EffectAnalyzer::InternalAnalyzer::scan(InternalAnalyzer *self,Expression **currp)

{
  Expression *this;
  bool bVar1;
  Try *pTVar2;
  size_t sVar3;
  Expression **currp_00;
  int local_2c;
  int i;
  ExpressionList *catchBodies;
  Expression *curr;
  Expression **currp_local;
  InternalAnalyzer *self_local;
  
  this = *currp;
  bVar1 = Expression::is<wasm::Try>(this);
  if (bVar1) {
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                       ::doVisitTry,currp);
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,doEndCatch,currp);
    pTVar2 = Expression::cast<wasm::Try>(this);
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      (&(pTVar2->catchBodies).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    local_2c = (int)sVar3;
    while (local_2c = local_2c + -1, -1 < local_2c) {
      currp_00 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar2->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)local_2c);
      Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
      ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                  *)self,scan,currp_00);
    }
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,doStartCatch,currp);
    pTVar2 = Expression::cast<wasm::Try>(this);
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,scan,&pTVar2->body);
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,doStartTry,currp);
  }
  else {
    PostWalker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::scan(self,currp);
  }
  return;
}

Assistant:

static void scan(InternalAnalyzer* self, Expression** currp) {
      Expression* curr = *currp;
      // We need to decrement try depth before catch starts, so handle it
      // separately
      if (curr->is<Try>()) {
        self->pushTask(doVisitTry, currp);
        self->pushTask(doEndCatch, currp);
        auto& catchBodies = curr->cast<Try>()->catchBodies;
        for (int i = int(catchBodies.size()) - 1; i >= 0; i--) {
          self->pushTask(scan, &catchBodies[i]);
        }
        self->pushTask(doStartCatch, currp);
        self->pushTask(scan, &curr->cast<Try>()->body);
        self->pushTask(doStartTry, currp);
        return;
      }
      PostWalker<InternalAnalyzer, OverriddenVisitor<InternalAnalyzer>>::scan(
        self, currp);
    }